

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3MemCompare(Mem *pMem1,Mem *pMem2,CollSeq *pColl)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  Mem c2;
  Mem c1;
  Mem local_a8;
  Mem local_68;
  
  uVar1 = pMem1->flags;
  uVar2 = pMem2->flags;
  uVar3 = uVar2 | uVar1;
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 0xc) == 0) {
      if ((uVar3 & 2) != 0) {
        if ((uVar1 & 2) == 0) {
          return 1;
        }
        if ((uVar2 & 2) == 0) {
          return -1;
        }
        if (pColl != (CollSeq *)0x0) {
          if (pMem1->enc != pColl->enc) {
            local_68.db = (sqlite3 *)0x0;
            local_68.z = (char *)0x0;
            local_68.r = 0.0;
            local_68.u.i = 0;
            local_68.n = 0;
            local_68.flags = 0;
            local_68.type = '\0';
            local_68.enc = '\0';
            local_68.xDel = (_func_void_void_ptr *)0x0;
            iVar10 = 0;
            local_68.zMalloc = (char *)0x0;
            local_a8.db = (sqlite3 *)0x0;
            local_a8.z = (char *)0x0;
            local_a8.r = 0.0;
            local_a8.u.i = 0;
            local_a8.n = 0;
            local_a8.flags = 0;
            local_a8.type = '\0';
            local_a8.enc = '\0';
            local_a8.xDel = (_func_void_void_ptr *)0x0;
            local_a8.zMalloc = (char *)0x0;
            sqlite3VdbeMemShallowCopy(&local_68,pMem1,0x1000);
            sqlite3VdbeMemShallowCopy(&local_a8,pMem2,0x1000);
            pvVar6 = sqlite3ValueText(&local_68,pColl->enc);
            iVar5 = 0;
            if (pvVar6 != (void *)0x0) {
              iVar5 = local_68.n;
            }
            pvVar7 = sqlite3ValueText(&local_a8,pColl->enc);
            if (pvVar7 != (void *)0x0) {
              iVar10 = local_a8.n;
            }
            iVar5 = (*pColl->xCmp)(pColl->pUser,iVar5,pvVar6,iVar10,pvVar7);
            sqlite3VdbeMemRelease(&local_68);
            sqlite3VdbeMemRelease(&local_a8);
            return iVar5;
          }
          iVar5 = (*pColl->xCmp)(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
          return iVar5;
        }
      }
      iVar5 = pMem1->n;
      iVar10 = pMem2->n;
      iVar8 = iVar10;
      if (iVar5 < iVar10) {
        iVar8 = iVar5;
      }
      uVar4 = memcmp(pMem1->z,pMem2->z,(long)iVar8);
      uVar9 = iVar5 - iVar10;
      if (uVar4 != 0) {
        uVar9 = uVar4;
      }
    }
    else if ((uVar1 & 0xc) == 0) {
      uVar9 = 1;
    }
    else {
      uVar9 = 0xffffffff;
      if ((uVar2 & 0xc) != 0) {
        if ((uVar1 & uVar2 & 4) == 0) {
          if ((uVar1 & 8) == 0) {
            dVar11 = (double)(pMem1->u).i;
          }
          else {
            dVar11 = pMem1->r;
          }
          if ((uVar2 & 8) == 0) {
            dVar12 = (double)(pMem2->u).i;
          }
          else {
            dVar12 = pMem2->r;
          }
          uVar9 = 0xffffffff;
          if (dVar12 <= dVar11) {
            uVar9 = (uint)(dVar12 < dVar11);
          }
        }
        else if ((pMem2->u).i <= (pMem1->u).i) {
          uVar9 = (uint)((pMem2->u).i < (pMem1->u).i);
        }
      }
    }
  }
  else {
    uVar9 = (uVar2 & 1) - (uVar1 & 1);
  }
  return uVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemCompare(const Mem *pMem1, const Mem *pMem2, const CollSeq *pColl){
  int rc;
  int f1, f2;
  int combined_flags;

  f1 = pMem1->flags;
  f2 = pMem2->flags;
  combined_flags = f1|f2;
  assert( (combined_flags & MEM_RowSet)==0 );
 
  /* If one value is NULL, it is less than the other. If both values
  ** are NULL, return 0.
  */
  if( combined_flags&MEM_Null ){
    return (f2&MEM_Null) - (f1&MEM_Null);
  }

  /* If one value is a number and the other is not, the number is less.
  ** If both are numbers, compare as reals if one is a real, or as integers
  ** if both values are integers.
  */
  if( combined_flags&(MEM_Int|MEM_Real) ){
    if( !(f1&(MEM_Int|MEM_Real)) ){
      return 1;
    }
    if( !(f2&(MEM_Int|MEM_Real)) ){
      return -1;
    }
    if( (f1 & f2 & MEM_Int)==0 ){
      double r1, r2;
      if( (f1&MEM_Real)==0 ){
        r1 = (double)pMem1->u.i;
      }else{
        r1 = pMem1->r;
      }
      if( (f2&MEM_Real)==0 ){
        r2 = (double)pMem2->u.i;
      }else{
        r2 = pMem2->r;
      }
      if( r1<r2 ) return -1;
      if( r1>r2 ) return 1;
      return 0;
    }else{
      assert( f1&MEM_Int );
      assert( f2&MEM_Int );
      if( pMem1->u.i < pMem2->u.i ) return -1;
      if( pMem1->u.i > pMem2->u.i ) return 1;
      return 0;
    }
  }

  /* If one value is a string and the other is a blob, the string is less.
  ** If both are strings, compare using the collating functions.
  */
  if( combined_flags&MEM_Str ){
    if( (f1 & MEM_Str)==0 ){
      return 1;
    }
    if( (f2 & MEM_Str)==0 ){
      return -1;
    }

    assert( pMem1->enc==pMem2->enc );
    assert( pMem1->enc==SQLITE_UTF8 || 
            pMem1->enc==SQLITE_UTF16LE || pMem1->enc==SQLITE_UTF16BE );

    /* The collation sequence must be defined at this point, even if
    ** the user deletes the collation sequence after the vdbe program is
    ** compiled (this was not always the case).
    */
    assert( !pColl || pColl->xCmp );

    if( pColl ){
      if( pMem1->enc==pColl->enc ){
        /* The strings are already in the correct encoding.  Call the
        ** comparison function directly */
        return pColl->xCmp(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
      }else{
        const void *v1, *v2;
        int n1, n2;
        Mem c1;
        Mem c2;
        memset(&c1, 0, sizeof(c1));
        memset(&c2, 0, sizeof(c2));
        sqlite3VdbeMemShallowCopy(&c1, pMem1, MEM_Ephem);
        sqlite3VdbeMemShallowCopy(&c2, pMem2, MEM_Ephem);
        v1 = sqlite3ValueText((sqlite3_value*)&c1, pColl->enc);
        n1 = v1==0 ? 0 : c1.n;
        v2 = sqlite3ValueText((sqlite3_value*)&c2, pColl->enc);
        n2 = v2==0 ? 0 : c2.n;
        rc = pColl->xCmp(pColl->pUser, n1, v1, n2, v2);
        sqlite3VdbeMemRelease(&c1);
        sqlite3VdbeMemRelease(&c2);
        return rc;
      }
    }
    /* If a NULL pointer was passed as the collate function, fall through
    ** to the blob case and use memcmp().  */
  }
 
  /* Both values must be blobs.  Compare using memcmp().  */
  rc = memcmp(pMem1->z, pMem2->z, (pMem1->n>pMem2->n)?pMem2->n:pMem1->n);
  if( rc==0 ){
    rc = pMem1->n - pMem2->n;
  }
  return rc;
}